

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.c
# Opt level: O0

void read_calendar_record
               (calendar_record_t *record,int field_count,char **field_names,char **field_values)

{
  int iVar1;
  service_availability_t sVar2;
  int local_2c;
  int i;
  char **field_values_local;
  char **field_names_local;
  int field_count_local;
  calendar_record_t *record_local;
  
  init_calendar_record(record);
  for (local_2c = 0; local_2c < field_count; local_2c = local_2c + 1) {
    iVar1 = strcmp(field_names[local_2c],"service_id");
    if (iVar1 == 0) {
      strcpy(record->service_id,field_values[local_2c]);
    }
    else {
      iVar1 = strcmp(field_names[local_2c],"start_date");
      if (iVar1 == 0) {
        strcpy(record->start_date,field_values[local_2c]);
      }
      else {
        iVar1 = strcmp(field_names[local_2c],"end_date");
        if (iVar1 == 0) {
          strcpy(record->end_date,field_values[local_2c]);
        }
        else {
          iVar1 = strcmp(field_names[local_2c],"monday");
          if (iVar1 == 0) {
            sVar2 = parse_service_availability(field_values[local_2c]);
            record->monday = sVar2;
          }
          else {
            iVar1 = strcmp(field_names[local_2c],"tuesday");
            if (iVar1 == 0) {
              sVar2 = parse_service_availability(field_values[local_2c]);
              record->tuesday = sVar2;
            }
            else {
              iVar1 = strcmp(field_names[local_2c],"wednesday");
              if (iVar1 == 0) {
                sVar2 = parse_service_availability(field_values[local_2c]);
                record->wednesday = sVar2;
              }
              else {
                iVar1 = strcmp(field_names[local_2c],"thursday");
                if (iVar1 == 0) {
                  sVar2 = parse_service_availability(field_values[local_2c]);
                  record->thursday = sVar2;
                }
                else {
                  iVar1 = strcmp(field_names[local_2c],"friday");
                  if (iVar1 == 0) {
                    sVar2 = parse_service_availability(field_values[local_2c]);
                    record->friday = sVar2;
                  }
                  else {
                    iVar1 = strcmp(field_names[local_2c],"saturday");
                    if (iVar1 == 0) {
                      sVar2 = parse_service_availability(field_values[local_2c]);
                      record->saturday = sVar2;
                    }
                    else {
                      iVar1 = strcmp(field_names[local_2c],"sunday");
                      if (iVar1 == 0) {
                        sVar2 = parse_service_availability(field_values[local_2c]);
                        record->sunday = sVar2;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void read_calendar_record(calendar_record_t *record, int field_count, const char **field_names, const char **field_values) {
    init_calendar_record(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "service_id") == 0) {
            strcpy(record->service_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "start_date") == 0) {
            strcpy(record->start_date, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "end_date") == 0) {
            strcpy(record->end_date, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "monday") == 0) {
            record->monday = parse_service_availability(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "tuesday") == 0) {
            record->tuesday = parse_service_availability(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "wednesday") == 0) {
            record->wednesday = parse_service_availability(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "thursday") == 0) {
            record->thursday = parse_service_availability(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "friday") == 0) {
            record->friday = parse_service_availability(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "saturday") == 0) {
            record->saturday = parse_service_availability(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "sunday") == 0) {
            record->sunday = parse_service_availability(field_values[i]);
            continue;
        }
    }
}